

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

string * common_detokenize_abi_cxx11_
                   (string *__return_storage_ptr__,llama_vocab *vocab,
                   vector<int,_std::allocator<int>_> *tokens,bool special)

{
  pointer piVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = (long)(tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2;
  uVar4 = 0xf;
  if (0xf < uVar3) {
    uVar4 = uVar3;
  }
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)uVar4);
  piVar1 = (tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar2 = llama_detokenize(vocab,piVar1,
                           (ulong)((long)(tokens->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar1)
                           >> 2,(__return_storage_ptr__->_M_dataplus)._M_p,
                           (int)__return_storage_ptr__->_M_string_length,0,special);
  if (iVar2 < 0) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,-(char)iVar2);
    piVar1 = (tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    iVar2 = llama_detokenize(vocab,piVar1,
                             (ulong)((long)(tokens->super__Vector_base<int,_std::allocator<int>_>).
                                           _M_impl.super__Vector_impl_data._M_finish - (long)piVar1)
                             >> 2,(__return_storage_ptr__->_M_dataplus)._M_p,
                             (int)__return_storage_ptr__->_M_string_length,0,special);
    if ((int)__return_storage_ptr__->_M_string_length < iVar2) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/common.cpp"
                 ,0x514,"GGML_ASSERT(%s) failed","n_chars <= (int32_t)text.size()");
    }
  }
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)iVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string common_detokenize(const struct llama_vocab * vocab, const std::vector<llama_token> & tokens, bool special) {
    std::string text;
    text.resize(std::max(text.capacity(), tokens.size()));
    int32_t n_chars = llama_detokenize(vocab, tokens.data(), (int32_t)tokens.size(), &text[0], (int32_t)text.size(), false, special);
    if (n_chars < 0) {
        text.resize(-n_chars);
        n_chars = llama_detokenize(vocab, tokens.data(), (int32_t)tokens.size(), &text[0], (int32_t)text.size(), false, special);
        GGML_ASSERT(n_chars <= (int32_t)text.size());  // whitespace trimming is performed after per-token detokenization
    }

    text.resize(n_chars);

    // NOTE: the original tokenizer decodes bytes after collecting the pieces.
    return text;
}